

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.hpp
# Opt level: O0

void __thiscall
duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>::~CachedJaroWinklerSimilarity
          (CachedJaroWinklerSimilarity<char> *this)

{
  BlockPatternMatchVector *in_RDI;
  
  common::BlockPatternMatchVector::~BlockPatternMatchVector(in_RDI);
  std::__cxx11::string::~string((string *)in_RDI);
  return;
}

Assistant:

CachedJaroWinklerSimilarity(InputIt1 first1, InputIt1 last1, double prefix_weight_ = 0.1)
        : s1(first1, last1), PM(first1, last1), prefix_weight(prefix_weight_)
    {
        if (prefix_weight < 0.0 || prefix_weight > 0.25) {
            throw std::invalid_argument("prefix_weight has to be between 0.0 and 0.25");
        }
    }